

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTF2Exporter::GetMatTexProp
          (glTF2Exporter *this,aiMaterial *mat,float *prop,char *propName,aiTextureType tt,uint slot
          )

{
  char *pKey;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string textureKey;
  uint slot_local;
  aiTextureType tt_local;
  char *propName_local;
  float *prop_local;
  aiMaterial *mat_local;
  glTF2Exporter *this_local;
  
  textureKey.field_2._8_4_ = slot;
  textureKey.field_2._12_4_ = tt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"$tex.file",&local_91);
  std::operator+(&local_70,&local_90,".");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,propName);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pKey = (char *)std::__cxx11::string::c_str();
  aiMaterial::Get(mat,pKey,textureKey.field_2._12_4_,textureKey.field_2._8_4_,prop);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void glTF2Exporter::GetMatTexProp(const aiMaterial* mat, float& prop, const char* propName, aiTextureType tt, unsigned int slot)
{
    std::string textureKey = std::string(_AI_MATKEY_TEXTURE_BASE) + "." + propName;

    mat->Get(textureKey.c_str(), tt, slot, prop);
}